

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapimin.c
# Opt level: O0

void default_decompress_parms(j_decompress_ptr cinfo)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long *in_RDI;
  int *_mp;
  int cid2;
  int cid1;
  int cid0;
  
  iVar1 = (int)in_RDI[7];
  if (iVar1 == 1) {
    *(undefined4 *)((long)in_RDI + 0x3c) = 1;
    *(undefined4 *)(in_RDI + 8) = 1;
  }
  else if (iVar1 == 3) {
    if (*(int *)((long)in_RDI + 0x174) == 0) {
      if ((int)in_RDI[0x30] == 0) {
        iVar1 = *(int *)in_RDI[0x26];
        iVar2 = *(int *)(in_RDI[0x26] + 0x60);
        iVar3 = *(int *)(in_RDI[0x26] + 0xc0);
        if (((iVar1 == 1) && (iVar2 == 2)) && (iVar3 == 3)) {
          *(undefined4 *)((long)in_RDI + 0x3c) = 3;
        }
        else if (((iVar1 == 0x52) && (iVar2 == 0x47)) && (iVar3 == 0x42)) {
          *(undefined4 *)((long)in_RDI + 0x3c) = 2;
        }
        else {
          lVar4 = *in_RDI;
          *(int *)(lVar4 + 0x2c) = iVar1;
          *(int *)(lVar4 + 0x30) = iVar2;
          *(int *)(lVar4 + 0x34) = iVar3;
          *(undefined4 *)(*in_RDI + 0x28) = 0x6f;
          (**(code **)(*in_RDI + 8))(in_RDI,1);
          *(undefined4 *)((long)in_RDI + 0x3c) = 3;
        }
      }
      else if (*(char *)((long)in_RDI + 0x184) == '\0') {
        *(undefined4 *)((long)in_RDI + 0x3c) = 2;
      }
      else if (*(char *)((long)in_RDI + 0x184) == '\x01') {
        *(undefined4 *)((long)in_RDI + 0x3c) = 3;
      }
      else {
        *(undefined4 *)(*in_RDI + 0x28) = 0x72;
        *(uint *)(*in_RDI + 0x2c) = (uint)*(byte *)((long)in_RDI + 0x184);
        (**(code **)(*in_RDI + 8))(in_RDI,0xffffffff);
        *(undefined4 *)((long)in_RDI + 0x3c) = 3;
      }
    }
    else {
      *(undefined4 *)((long)in_RDI + 0x3c) = 3;
    }
    *(undefined4 *)(in_RDI + 8) = 2;
  }
  else if (iVar1 == 4) {
    if ((int)in_RDI[0x30] == 0) {
      *(undefined4 *)((long)in_RDI + 0x3c) = 4;
    }
    else if (*(char *)((long)in_RDI + 0x184) == '\0') {
      *(undefined4 *)((long)in_RDI + 0x3c) = 4;
    }
    else if (*(char *)((long)in_RDI + 0x184) == '\x02') {
      *(undefined4 *)((long)in_RDI + 0x3c) = 5;
    }
    else {
      *(undefined4 *)(*in_RDI + 0x28) = 0x72;
      *(uint *)(*in_RDI + 0x2c) = (uint)*(byte *)((long)in_RDI + 0x184);
      (**(code **)(*in_RDI + 8))(in_RDI,0xffffffff);
      *(undefined4 *)((long)in_RDI + 0x3c) = 5;
    }
    *(undefined4 *)(in_RDI + 8) = 4;
  }
  else {
    *(undefined4 *)((long)in_RDI + 0x3c) = 0;
    *(undefined4 *)(in_RDI + 8) = 0;
  }
  *(undefined4 *)((long)in_RDI + 0x44) = 1;
  *(undefined4 *)(in_RDI + 9) = 1;
  in_RDI[10] = 0x3ff0000000000000;
  *(undefined4 *)(in_RDI + 0xb) = 0;
  *(undefined4 *)((long)in_RDI + 0x5c) = 0;
  *(undefined4 *)(in_RDI + 0xc) = 0;
  *(undefined4 *)((long)in_RDI + 100) = 1;
  *(undefined4 *)(in_RDI + 0xd) = 1;
  *(undefined4 *)((long)in_RDI + 0x6c) = 0;
  *(undefined4 *)(in_RDI + 0xe) = 2;
  *(undefined4 *)((long)in_RDI + 0x74) = 1;
  *(undefined4 *)(in_RDI + 0xf) = 0x100;
  in_RDI[0x14] = 0;
  *(undefined4 *)((long)in_RDI + 0x7c) = 0;
  *(undefined4 *)(in_RDI + 0x10) = 0;
  *(undefined4 *)((long)in_RDI + 0x84) = 0;
  return;
}

Assistant:

LOCAL(void)
default_decompress_parms(j_decompress_ptr cinfo)
{
  /* Guess the input colorspace, and set output colorspace accordingly. */
  /* (Wish JPEG committee had provided a real way to specify this...) */
  /* Note application may override our guesses. */
  switch (cinfo->num_components) {
  case 1:
    cinfo->jpeg_color_space = JCS_GRAYSCALE;
    cinfo->out_color_space = JCS_GRAYSCALE;
    break;

  case 3:
    if (cinfo->saw_JFIF_marker) {
      cinfo->jpeg_color_space = JCS_YCbCr; /* JFIF implies YCbCr */
    } else if (cinfo->saw_Adobe_marker) {
      switch (cinfo->Adobe_transform) {
      case 0:
        cinfo->jpeg_color_space = JCS_RGB;
        break;
      case 1:
        cinfo->jpeg_color_space = JCS_YCbCr;
        break;
      default:
        WARNMS1(cinfo, JWRN_ADOBE_XFORM, cinfo->Adobe_transform);
        cinfo->jpeg_color_space = JCS_YCbCr; /* assume it's YCbCr */
        break;
      }
    } else {
      /* Saw no special markers, try to guess from the component IDs */
      int cid0 = cinfo->comp_info[0].component_id;
      int cid1 = cinfo->comp_info[1].component_id;
      int cid2 = cinfo->comp_info[2].component_id;

      if (cid0 == 1 && cid1 == 2 && cid2 == 3)
        cinfo->jpeg_color_space = JCS_YCbCr; /* assume JFIF w/out marker */
      else if (cid0 == 82 && cid1 == 71 && cid2 == 66)
        cinfo->jpeg_color_space = JCS_RGB; /* ASCII 'R', 'G', 'B' */
      else {
        TRACEMS3(cinfo, 1, JTRC_UNKNOWN_IDS, cid0, cid1, cid2);
        cinfo->jpeg_color_space = JCS_YCbCr; /* assume it's YCbCr */
      }
    }
    /* Always guess RGB is proper output colorspace. */
    cinfo->out_color_space = JCS_RGB;
    break;

  case 4:
    if (cinfo->saw_Adobe_marker) {
      switch (cinfo->Adobe_transform) {
      case 0:
        cinfo->jpeg_color_space = JCS_CMYK;
        break;
      case 2:
        cinfo->jpeg_color_space = JCS_YCCK;
        break;
      default:
        WARNMS1(cinfo, JWRN_ADOBE_XFORM, cinfo->Adobe_transform);
        cinfo->jpeg_color_space = JCS_YCCK; /* assume it's YCCK */
        break;
      }
    } else {
      /* No special markers, assume straight CMYK. */
      cinfo->jpeg_color_space = JCS_CMYK;
    }
    cinfo->out_color_space = JCS_CMYK;
    break;

  default:
    cinfo->jpeg_color_space = JCS_UNKNOWN;
    cinfo->out_color_space = JCS_UNKNOWN;
    break;
  }

  /* Set defaults for other decompression parameters. */
  cinfo->scale_num = 1;         /* 1:1 scaling */
  cinfo->scale_denom = 1;
  cinfo->output_gamma = 1.0;
  cinfo->buffered_image = FALSE;
  cinfo->raw_data_out = FALSE;
  cinfo->dct_method = JDCT_DEFAULT;
  cinfo->do_fancy_upsampling = TRUE;
  cinfo->do_block_smoothing = TRUE;
  cinfo->quantize_colors = FALSE;
  /* We set these in case application only sets quantize_colors. */
  cinfo->dither_mode = JDITHER_FS;
#ifdef QUANT_2PASS_SUPPORTED
  cinfo->two_pass_quantize = TRUE;
#else
  cinfo->two_pass_quantize = FALSE;
#endif
  cinfo->desired_number_of_colors = 256;
  cinfo->colormap = NULL;
  /* Initialize for no mode change in buffered-image mode. */
  cinfo->enable_1pass_quant = FALSE;
  cinfo->enable_external_quant = FALSE;
  cinfo->enable_2pass_quant = FALSE;
}